

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Biquad.cpp
# Opt level: O0

void __thiscall
Iir::Biquad::setCoefficients
          (Biquad *this,double a0,double a1,double a2,double b0,double b1,double b2)

{
  bool bVar1;
  double *in_RDI;
  double in_XMM0_Qa;
  double in_XMM1_Qa;
  double in_XMM2_Qa;
  double in_XMM3_Qa;
  char *in_XMM4_Qa;
  double in_XMM5_Qa;
  
  bVar1 = is_nan<double>(in_XMM0_Qa);
  if (bVar1) {
    throw_invalid_argument(in_XMM4_Qa);
  }
  bVar1 = is_nan<double>(in_XMM1_Qa);
  if (bVar1) {
    throw_invalid_argument(in_XMM4_Qa);
  }
  bVar1 = is_nan<double>(in_XMM2_Qa);
  if (bVar1) {
    throw_invalid_argument(in_XMM4_Qa);
  }
  bVar1 = is_nan<double>(in_XMM3_Qa);
  if (bVar1) {
    throw_invalid_argument(in_XMM4_Qa);
  }
  bVar1 = is_nan<double>((double)in_XMM4_Qa);
  if (bVar1) {
    throw_invalid_argument(in_XMM4_Qa);
  }
  bVar1 = is_nan<double>(in_XMM5_Qa);
  if (bVar1) {
    throw_invalid_argument(in_XMM4_Qa);
  }
  *in_RDI = in_XMM0_Qa;
  in_RDI[1] = in_XMM1_Qa / in_XMM0_Qa;
  in_RDI[2] = in_XMM2_Qa / in_XMM0_Qa;
  in_RDI[5] = in_XMM3_Qa / in_XMM0_Qa;
  in_RDI[3] = (double)in_XMM4_Qa / in_XMM0_Qa;
  in_RDI[4] = in_XMM5_Qa / in_XMM0_Qa;
  return;
}

Assistant:

void Biquad::setCoefficients (double a0, double a1, double a2,
					  double b0, double b1, double b2)
	{
		if (Iir::is_nan (a0)) throw_invalid_argument("a0 is NaN");
		if (Iir::is_nan (a1)) throw_invalid_argument("a1 is NaN");
		if (Iir::is_nan (a2)) throw_invalid_argument("a2 is NaN");
		if (Iir::is_nan (b0)) throw_invalid_argument("b0 is NaN");
		if (Iir::is_nan (b1)) throw_invalid_argument("b1 is NaN");
		if (Iir::is_nan (b2)) throw_invalid_argument("b2 is NaN");

		m_a0 = a0;
		m_a1 = a1/a0;
		m_a2 = a2/a0;
		m_b0 = b0/a0;
		m_b1 = b1/a0;
		m_b2 = b2/a0;
	}